

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.c
# Opt level: O3

void reap_worker(void *unused)

{
  nni_cb p_Var1;
  size_t sVar2;
  nni_reap_node *pnVar3;
  bool bVar4;
  bool bVar5;
  nni_reap_list **ppnVar6;
  nni_reap_node *pnVar7;
  nni_reap_list *pnVar8;
  bool bVar9;
  
  nni_thr_set_name((nni_thr *)0x0,"nng:reap2");
  nni_mtx_lock(&reap_mtx);
  do {
    while (reap_list == (nni_reap_list *)0x0) {
LAB_001152f1:
      reap_empty = 1;
      nni_cv_wake(&reap_empty_cv);
      if (reap_exit != '\0') {
        nni_mtx_unlock(&reap_mtx);
        return;
      }
      nni_cv_wait(&reap_work_cv);
    }
    pnVar8 = reap_list;
    bVar4 = true;
    do {
      while( true ) {
        pnVar7 = pnVar8->rl_nodes;
        bVar9 = pnVar7 == (nni_reap_node *)0x0;
        if (!bVar9) break;
        ppnVar6 = &pnVar8->rl_next;
        pnVar8 = *ppnVar6;
        if ((*ppnVar6 == (nni_reap_list *)0x0) &&
           (bVar5 = bVar4 || reap_list == (nni_reap_list *)0x0, pnVar8 = reap_list, bVar4 = bVar9,
           bVar5)) goto LAB_001152f1;
      }
      p_Var1 = pnVar8->rl_func;
      pnVar8->rl_nodes = (nni_reap_node *)0x0;
      sVar2 = pnVar8->rl_offset;
      nni_mtx_unlock(&reap_mtx);
      do {
        pnVar3 = pnVar7->rn_next;
        (*p_Var1)((void *)((long)pnVar7 - sVar2));
        pnVar7 = pnVar3;
      } while (pnVar3 != (nni_reap_node *)0x0);
      nni_mtx_lock(&reap_mtx);
      pnVar8 = pnVar8->rl_next;
      bVar4 = bVar9;
    } while (pnVar8 != (nni_reap_list *)0x0);
  } while( true );
}

Assistant:

static void
reap_worker(void *unused)
{
	NNI_ARG_UNUSED(unused);
	nni_thr_set_name(NULL, "nng:reap2");

	nni_mtx_lock(&reap_mtx);
	for (;;) {
		nni_reap_list *list;
		bool           reaped = false;

		for (list = reap_list; list != NULL; list = list->rl_next) {
			nni_reap_node *node;
			size_t         offset;
			nni_cb         func;

			if ((node = list->rl_nodes) == NULL) {
				continue;
			}

			reaped         = true;
			offset         = list->rl_offset;
			func           = list->rl_func;
			list->rl_nodes = NULL;

			// We process our list of nodes while not holding
			// the lock.
			nni_mtx_unlock(&reap_mtx);
			while (node != NULL) {
				void *ptr;
				ptr  = ((char *) node) - offset;
				node = node->rn_next;
				func(ptr);
			}
			nni_mtx_lock(&reap_mtx);
		}
		if (!reaped) {
			reap_empty = true;
			nni_cv_wake(&reap_empty_cv);
			if (reap_exit) {
				nni_mtx_unlock(&reap_mtx);
				return;
			}
			nni_cv_wait(&reap_work_cv);
		}
	}
}